

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

boolean create_critters(int cnt,permonst *mptr)

{
  uint uVar1;
  boolean bVar2;
  boolean bVar3;
  boolean bVar4;
  monst *worm;
  obj *poVar5;
  boolean bVar6;
  boolean bVar7;
  xchar xVar8;
  xchar xVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  coord c;
  coord local_5a;
  permonst *local_58;
  permonst *local_50;
  permonst *local_48;
  permonst *local_40;
  permonst *local_38;
  
  bVar12 = flags.debug == '\0';
  local_38 = mons + 0x14c;
  local_48 = mons + 0x1e;
  local_50 = mons + 0x31;
  local_40 = mons + 0x32;
  local_58 = mptr;
  bVar3 = '\0';
  do {
    do {
      iVar11 = 1 - cnt;
      bVar4 = bVar3;
      do {
        bVar6 = bVar4;
        iVar10 = iVar11;
        iVar11 = iVar10 + 1;
        if (iVar11 == 2) {
          return bVar6;
        }
        bVar7 = bVar3;
        if (bVar12) break;
        bVar2 = create_particular();
        bVar4 = '\x01';
        bVar7 = bVar6;
      } while (bVar2 != '\0');
      xVar9 = u.uy;
      xVar8 = u.ux;
      if (((local_58 == (permonst *)0x0) && ((u._1052_1_ & 2) != 0)) &&
         (bVar3 = enexto(&local_5a,level,u.ux,u.uy,local_38), bVar3 != '\0')) {
        xVar8 = local_5a.x;
        xVar9 = local_5a.y;
      }
      cnt = -iVar10;
      worm = makemon(local_58,level,(int)xVar8,(int)xVar9,0);
      bVar12 = true;
      bVar3 = bVar7;
    } while (worm == (monst *)0x0);
    if (worm->wormno == '\0') {
      if ((viz_array[worm->my][worm->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bf264;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bf25b;
        }
        else {
LAB_001bf25b:
          if (ublindf == (obj *)0x0) goto LAB_001bf30d;
LAB_001bf264:
          if (ublindf->oartifact != '\x1d') goto LAB_001bf30d;
        }
        if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))
        goto LAB_001bf30d;
      }
LAB_001bf2bf:
      uVar1 = *(uint *)&worm->field_0x60;
      if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001bf300;
        goto LAB_001bf30d;
      }
      if ((uVar1 & 0x280) != 0) goto LAB_001bf30d;
LAB_001bf300:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001bf30d;
      goto LAB_001bf419;
    }
    bVar4 = worm_known(level,worm);
    if (bVar4 != '\0') goto LAB_001bf2bf;
LAB_001bf30d:
    if (((worm->data->mflags1 & 0x10000) == 0) &&
       ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
        (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bf35d;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bf358;
      }
      else {
LAB_001bf358:
        if (ublindf != (obj *)0x0) {
LAB_001bf35d:
          if (ublindf->oartifact == '\x1d') goto LAB_001bf3ca;
        }
        if ((((youmonst.data == local_50 || youmonst.data == local_48) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == local_40) && (u.uprops[0x19].blocked == 0)) goto LAB_001bf419;
      }
LAB_001bf3ca:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar11 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar11 < 0x41))))
      goto LAB_001bf419;
    }
    if ((u.uprops[0x42].intrinsic != 0) ||
       ((u.uprops[0x42].extrinsic != 0 || (bVar4 = match_warn_of_mon(worm), bVar4 != '\0')))) {
LAB_001bf419:
      bVar3 = '\x01';
      bVar12 = true;
    }
  } while( true );
}

Assistant:

boolean create_critters(int cnt,
			const struct permonst *mptr) /* usually null; used for confused reading */
{
	coord c;
	int x, y;
	struct monst *mon;
	boolean known = FALSE;
	boolean ask = wizard;

	while (cnt--) {
	    if (ask) {
		if (create_particular()) {
		    known = TRUE;
		    continue;
		}
		else ask = FALSE;	/* ESC will shut off prompting */
	    }
	    x = u.ux,  y = u.uy;
	    /* if in water, try to encourage an aquatic monster
	       by finding and then specifying another wet location */
	    if (!mptr && u.uinwater && enexto(&c, level, x, y, &mons[PM_GIANT_EEL]))
		x = c.x,  y = c.y;

	    mon = makemon(mptr, level, x, y, NO_MM_FLAGS);
	    if (mon && canspotmon(level, mon)) known = TRUE;
	}
	return known;
}